

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::EnhancedLayouts::XFBCaptureInactiveOutputVariableTest::executeDrawCall
          (XFBCaptureInactiveOutputVariableTest *this,GLuint test_case_index)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined4 uVar4;
  long lVar3;
  
  iVar1 = (*((this->super_BufferTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  uVar4 = 0xe;
  if (test_case_index == 0) {
    uVar4 = 0;
  }
  (**(code **)(lVar3 + 0x4e8))(0x8c89);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Disable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x64b7);
  (**(code **)(lVar3 + 0x30))(0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BeginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x64ba);
  (**(code **)(lVar3 + 0x538))(uVar4,0,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x64bd);
  (**(code **)(lVar3 + 0x638))();
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"EndTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x64c0);
  return true;
}

Assistant:

bool XFBCaptureInactiveOutputVariableTest::executeDrawCall(GLuint test_case_index)
{
	const Functions& gl				= m_context.getRenderContext().getFunctions();
	GLenum			 primitive_type = GL_PATCHES;

	if (TEST_VS == test_case_index)
	{
		primitive_type = GL_POINTS;
	}

	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Disable");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

	gl.drawArrays(primitive_type, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

	return true;
}